

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

span<const_slang::ast::Expression_*const,_18446744073709551615UL>
slang::ast::bindExpressionList
          (Type *patternType,Type *elementType,size_t replCount,bitwidth_t expectedCount,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,ASTContext *context,
          SourceRange sourceRange,bool *bad)

{
  SourceRange sourceRange_00;
  bool bVar1;
  SourceLocation SVar2;
  size_type sVar3;
  Compilation *__s;
  uint in_ECX;
  long in_RDX;
  EVP_PKEY_CTX *src;
  undefined8 in_R8;
  const_iterator cVar4;
  byte *in_stack_00000018;
  Diagnostic *diag;
  Expression *expr;
  ExpressionSyntax *item;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  ArgumentDirection direction;
  bool isLValue;
  iterator_base<const_slang::syntax::ExpressionSyntax_*> *in_stack_fffffffffffffe38;
  Expression *in_stack_fffffffffffffe40;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffe48;
  Diagnostic *in_stack_fffffffffffffe50;
  ASTContext *in_stack_fffffffffffffe58;
  SourceLocation in_stack_fffffffffffffe60;
  DiagCode in_stack_fffffffffffffe74;
  Type *in_stack_fffffffffffffe88;
  Diagnostic *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffed8;
  Type *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  bitmask<slang::ast::VariableFlags> local_e2;
  Type *local_e0;
  Diagnostic *local_d8;
  const_iterator local_d0;
  const_iterator local_b0;
  undefined8 local_a0;
  SmallVectorBase<const_slang::ast::Expression_*> local_98 [2];
  uint local_54;
  bitmask<slang::ast::ASTFlags> local_50;
  undefined1 local_41;
  undefined8 local_38;
  uint local_2c;
  long local_28;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_10;
  
  local_38 = in_R8;
  local_2c = in_ECX;
  local_28 = in_RDX;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_50,LValue);
  local_41 = bitmask<slang::ast::ASTFlags>::has
                       ((bitmask<slang::ast::ASTFlags> *)in_stack_fffffffffffffe50,
                        in_stack_fffffffffffffe48);
  local_54 = (uint)(byte)local_41;
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9c2054);
  local_a0 = local_38;
  cVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                    ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x9c2071);
  local_b0 = cVar4;
  local_d0 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x9c20b0);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
                      ((self_type *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_fffffffffffffe90 =
         (Diagnostic *)
         iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
         ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                      *)0x9c210d);
    local_e2.m_bits = 0;
    local_d8 = in_stack_fffffffffffffe90;
    bitmask<slang::ast::VariableFlags>::bitmask(&local_e2);
    in_stack_fffffffffffffe88 =
         (Type *)Expression::bindArgument
                           (in_stack_fffffffffffffee0,
                            (ArgumentDirection)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                            (bitmask<slang::ast::VariableFlags>)
                            (underlying_type)((ulong)in_stack_fffffffffffffee8 >> 0x30),
                            (ExpressionSyntax *)cVar4.list,(ASTContext *)cVar4.index);
    local_e0 = in_stack_fffffffffffffe88;
    SmallVectorBase<const_slang::ast::Expression_*>::push_back
              ((SmallVectorBase<const_slang::ast::Expression_*> *)in_stack_fffffffffffffe40,
               (Expression **)in_stack_fffffffffffffe38);
    bVar1 = Expression::bad(in_stack_fffffffffffffe40);
    in_stack_fffffffffffffe74.code._1_1_ = bVar1;
    *in_stack_00000018 = (*in_stack_00000018 & 1) != 0 || bVar1;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<const_slang::syntax::ExpressionSyntax_*>,_false>
                *)in_stack_fffffffffffffe40);
  }
  if (((*in_stack_00000018 & 1) == 0) && (local_2c != 0)) {
    SVar2._4_4_ = 0;
    SVar2._0_4_ = local_2c;
    sVar3 = SmallVectorBase<const_slang::ast::Expression_*>::size(local_98);
    if (SVar2 != (SourceLocation)(sVar3 * local_28)) {
      sourceRange_00.endLoc = SVar2;
      sourceRange_00.startLoc = in_stack_fffffffffffffe60;
      ASTContext::addDiag(in_stack_fffffffffffffe58,in_stack_fffffffffffffe74,sourceRange_00);
      operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      in_stack_fffffffffffffe50 =
           Diagnostic::operator<<<unsigned_int>
                     (in_stack_fffffffffffffe50,(uint)((ulong)in_stack_fffffffffffffe48 >> 0x20));
      SmallVectorBase<const_slang::ast::Expression_*>::size(local_98);
      Diagnostic::operator<<<unsigned_long>
                (in_stack_fffffffffffffe50,(unsigned_long)in_stack_fffffffffffffe48);
      *in_stack_00000018 = 1;
    }
  }
  __s = ASTContext::getCompilation((ASTContext *)0x9c2331);
  SmallVectorBase<const_slang::ast::Expression_*>::copy(local_98,(EVP_PKEY_CTX *)__s,src);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffe50,
             (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)__s);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x9c2390);
  return local_10;
}

Assistant:

static std::span<const Expression* const> bindExpressionList(
    const Type& patternType, const Type& elementType, size_t replCount, bitwidth_t expectedCount,
    const SeparatedSyntaxList<ExpressionSyntax>& items, const ASTContext& context,
    SourceRange sourceRange, bool& bad) {

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    auto direction = isLValue ? ArgumentDirection::Out : ArgumentDirection::In;

    SmallVector<const Expression*> elems;
    for (auto item : items) {
        auto& expr = Expression::bindArgument(elementType, direction, {}, *item, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    if (!bad && expectedCount && expectedCount != elems.size() * replCount) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << patternType << expectedCount << elems.size();
        bad = true;
    }

    return elems.copy(context.getCompilation());
}